

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_io.c
# Opt level: O3

ssize_t tnt_io_flush(tnt_stream_net *s)

{
  size_t size;
  ssize_t sVar1;
  
  size = (s->sbuf).off;
  if (size != 0) {
    sVar1 = tnt_io_send_raw(s,(s->sbuf).buf,size,1);
    if (sVar1 == -1) {
      sVar1 = -1;
    }
    else {
      (s->sbuf).off = 0;
    }
    return sVar1;
  }
  return 0;
}

Assistant:

ssize_t tnt_io_flush(struct tnt_stream_net *s) {
	if (s->sbuf.off == 0)
		return 0;
	ssize_t rc = tnt_io_send_raw(s, s->sbuf.buf, s->sbuf.off, 1);
	if (rc == -1)
		return -1;
	s->sbuf.off = 0;
	return rc;
}